

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O2

int __thiscall cmCTestSubmitHandler::GetSubmitInactivityTimeout(cmCTestSubmitHandler *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  ostream *poVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  int iVar5;
  unsigned_long timeout;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  local_1d0 [2];
  string local_1b0;
  ostringstream cmCTestLog_msg;
  
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"SubmitInactivityTimeout",(allocator<char> *)local_1d0);
  cmCTest::GetCTestConfiguration(&local_1b0,pcVar1,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  if (local_1b0._M_string_length == 0) {
    iVar5 = 0x78;
  }
  else {
    bVar2 = cmStrToULong(&local_1b0,&timeout);
    iVar5 = (int)timeout;
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"SubmitInactivityTimeout is invalid: ");
      local_1d0[0]._M_delim = '\"';
      local_1d0[0]._M_escape = '\\';
      local_1d0[0]._M_string = &local_1b0;
      pbVar4 = std::__detail::operator<<(poVar3,local_1d0);
      poVar3 = std::operator<<(pbVar4,".");
      poVar3 = std::operator<<(poVar3," Using a default value of ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x78);
      poVar3 = std::operator<<(poVar3,".");
      std::endl<char,std::char_traits<char>>(poVar3);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                   ,0x394,(char *)local_1d0[0]._M_string,false);
      std::__cxx11::string::~string((string *)local_1d0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      iVar5 = 0x78;
    }
  }
  std::__cxx11::string::~string((string *)&local_1b0);
  return iVar5;
}

Assistant:

int cmCTestSubmitHandler::GetSubmitInactivityTimeout()
{
  int submitInactivityTimeout = SUBMIT_TIMEOUT_IN_SECONDS_DEFAULT;
  std::string const& timeoutStr =
    this->CTest->GetCTestConfiguration("SubmitInactivityTimeout");
  if (!timeoutStr.empty()) {
    unsigned long timeout;
    if (cmStrToULong(timeoutStr, &timeout)) {
      submitInactivityTimeout = static_cast<int>(timeout);
    } else {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "SubmitInactivityTimeout is invalid: "
                   << cm::quoted(timeoutStr) << "."
                   << " Using a default value of "
                   << SUBMIT_TIMEOUT_IN_SECONDS_DEFAULT << "." << std::endl);
    }
  }
  return submitInactivityTimeout;
}